

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,ImGuiContext *context,char *name)

{
  ImU32 IVar1;
  ImGuiID IVar2;
  char *str;
  ImVector<unsigned_int> *this_00;
  size_t sVar3;
  char *in_RDX;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  ImGuiMenuColumns *in_stack_ffffffffffffff30;
  char *str_00;
  ImGuiWindow *this_01;
  ImDrawListSharedData *shared_data;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uStack_78;
  undefined4 local_74;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  float fStack_68;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c [2];
  char *local_18;
  
  local_18 = in_RDX;
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 2));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 3));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 4));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 5));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 6));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 7));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 8));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x5c));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 100));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x6c));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x74));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0xbc));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0xc4));
  ImGuiWindowTempData::ImGuiWindowTempData
            ((ImGuiWindowTempData *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  shared_data = (ImDrawListSharedData *)(in_RDI + 0x3d);
  ImVector<unsigned_int>::ImVector((ImVector<unsigned_int> *)shared_data);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
  ImGuiMenuColumns::ImGuiMenuColumns(in_stack_ffffffffffffff30);
  ImGuiStorage::ImGuiStorage((ImGuiStorage *)0x13bd09);
  ImVector<ImGuiColumnsSet>::ImVector((ImVector<ImGuiColumnsSet> *)(in_RDI + 0x52));
  this_01 = (ImGuiWindow *)(in_RDI + 0x56);
  ImDrawList::ImDrawList
            ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),shared_data
            );
  str = (char *)(in_RDI + 0x71);
  str_00 = (char *)(in_RDI + 0x75);
  do {
    ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
    str = str + 0x10;
  } while (str != str_00);
  this_00 = (ImVector<unsigned_int> *)ImStrdup(str_00);
  *in_RDI = this_00;
  IVar1 = ImHash(local_18,0,0);
  *(ImU32 *)(in_RDI + 1) = IVar1;
  ImVector<unsigned_int>::push_back
            (this_00,(uint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  ImVec2::ImVec2(local_2c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 2) = local_2c[0];
  ImVec2::ImVec2(&local_34,0.0,0.0);
  *(ImVec2 *)(in_RDI + 4) = local_34;
  in_RDI[3] = in_RDI[4];
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 7) = local_3c;
  in_RDI[6] = in_RDI[7];
  ImVec2::ImVec2(&local_44,0.0,0.0);
  *(ImVec2 *)(in_RDI + 8) = local_44;
  *(undefined4 *)(in_RDI + 9) = 0;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  sVar3 = strlen(local_18);
  *(int *)(in_RDI + 10) = (int)sVar3 + 1;
  IVar2 = GetID(this_01,str,str_00);
  *(ImGuiID *)((long)in_RDI + 0x54) = IVar2;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  *(ImVec2 *)((long)in_RDI + 0x5c) = local_4c;
  ImVec2::ImVec2(&local_54,3.4028235e+38,3.4028235e+38);
  *(ImVec2 *)((long)in_RDI + 100) = local_54;
  ImVec2::ImVec2(&local_5c,0.5,0.5);
  *(ImVec2 *)((long)in_RDI + 0x6c) = local_5c;
  ImVec2::ImVec2(&local_64,0.0,0.0);
  *(ImVec2 *)((long)in_RDI + 0x74) = local_64;
  *(undefined1 *)((long)in_RDI + 0x7d) = 0;
  *(undefined1 *)((long)in_RDI + 0x7c) = 0;
  *(undefined1 *)((long)in_RDI + 0x7f) = 0;
  *(undefined1 *)((long)in_RDI + 0x7e) = 0;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)((long)in_RDI + 0x81) = 0;
  *(undefined1 *)((long)in_RDI + 0x82) = 0;
  *(undefined1 *)((long)in_RDI + 0x83) = 0;
  *(undefined1 *)((long)in_RDI + 0x84) = 0;
  *(undefined1 *)((long)in_RDI + 0x85) = 0;
  *(undefined1 *)((long)in_RDI + 0x86) = 0;
  *(undefined2 *)(in_RDI + 0x11) = 0;
  *(undefined2 *)((long)in_RDI + 0x8a) = 0xffff;
  *(undefined2 *)((long)in_RDI + 0x8c) = 0xffff;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x94) = 0xffffffff;
  *(undefined1 *)((long)in_RDI + 0x9c) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined4 *)((long)in_RDI + 0xa4) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xac) = 0;
  *(undefined4 *)(in_RDI + 0x15) = 0;
  *(undefined4 *)(in_RDI + 0x17) = 0xf;
  *(undefined4 *)((long)in_RDI + 0xb4) = 0xf;
  *(undefined4 *)(in_RDI + 0x16) = 0xf;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,3.4028235e+38,3.4028235e+38);
  *(ulong *)((long)in_RDI + 0xc4) = CONCAT44(fStack_68,in_stack_ffffffffffffff94);
  *(undefined8 *)((long)in_RDI + 0xbc) = *(undefined8 *)((long)in_RDI + 0xc4);
  *(undefined4 *)(in_RDI + 0x49) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x24c) = 0;
  *(undefined4 *)(in_RDI + 0x54) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0x2a4) = 0xffffffff;
  in_RDI[0x55] = in_RDI + 0x56;
  *(undefined8 *)(in_RDI[0x55] + 0x40) = *in_RDI;
  in_RDI[0x6b] = 0;
  in_RDI[0x6c] = 0;
  in_RDI[0x6d] = 0;
  in_RDI[0x6e] = 0;
  *(undefined4 *)((long)in_RDI + 900) = 0;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  ImRect::ImRect((ImRect *)this_00);
  in_RDI[0x73] = CONCAT44(uStack_78,in_stack_ffffffffffffff84);
  in_RDI[0x74] = CONCAT44(in_stack_ffffffffffffff90,local_74);
  in_RDI[0x71] = in_RDI[0x73];
  in_RDI[0x72] = in_RDI[0x74];
  in_RDI[0x6f] = 0;
  *(undefined4 *)((long)in_RDI + 0x3ac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x75) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x3b4) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x76) = 0x7fffffff;
  *(undefined4 *)((long)in_RDI + 0x3bc) = 0x7fffffff;
  *(undefined4 *)(in_RDI + 0x77) = 0x7fffffff;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(ImGuiContext* context, const char* name)
    : DrawListInst(&context->DrawListSharedData)
{
    Name = ImStrdup(name);
    ID = ImHash(name, 0);
    IDStack.push_back(ID);
    Flags = ImGuiWindowFlags_None;
    Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    SizeContents = SizeContentsExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    WindowRounding = 0.0f;
    WindowBorderSize = 0.0f;
    NameBufLen = (int)strlen(name) + 1;
    MoveId = GetID("#MOVE");
    ChildId = 0;
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    ScrollbarX = ScrollbarY = false;
    Active = WasActive = false;
    WriteAccessed = false;
    Collapsed = false;
    WantCollapseToggle = false;
    SkipItems = false;
    Appearing = false;
    Hidden = false;
    HasCloseButton = false;
    BeginCount = 0;
    BeginOrderWithinParent = -1;
    BeginOrderWithinContext = -1;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitOnlyGrows = false;
    AutoFitChildAxises = 0x00;
    AutoPosLastDirection = ImGuiDir_None;
    HiddenFramesRegular = HiddenFramesForResize = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;
    SetWindowPosVal = SetWindowPosPivot = ImVec2(FLT_MAX, FLT_MAX);

    LastFrameActive = -1;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;
    SettingsIdx = -1;

    DrawList = &DrawListInst;
    DrawList->_OwnerName = Name;
    ParentWindow = NULL;
    RootWindow = NULL;
    RootWindowForTitleBarHighlight = NULL;
    RootWindowForNav = NULL;

    NavLastIds[0] = NavLastIds[1] = 0;
    NavRectRel[0] = NavRectRel[1] = ImRect();
    NavLastChildNavWindow = NULL;

    FocusIdxAllCounter = FocusIdxTabCounter = -1;
    FocusIdxAllRequestCurrent = FocusIdxTabRequestCurrent = INT_MAX;
    FocusIdxAllRequestNext = FocusIdxTabRequestNext = INT_MAX;
}